

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

golf_entity_t * golf_entity_make_copy(golf_entity_t *__return_storage_ptr__,golf_entity_t *entity)

{
  golf_geo_point_t *pgVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec_vec2_t uvs;
  vec_int_t idx;
  vec_golf_geo_generator_data_arg_t args_00;
  vec_golf_geo_point_t points;
  vec_vec2_t uvs_00;
  vec_golf_geo_face_t faces;
  golf_geo_generator_data_t generator_data;
  vec3 water_dir;
  vec3 position;
  char *pcVar5;
  int iVar6;
  golf_lightmap_section_t *lightmap_name;
  golf_geo_t *pgVar7;
  long lVar8;
  golf_geo_point_t gVar9;
  golf_entity_t *entity_copy;
  golf_geo_generator_data_t local_300;
  int local_2dc;
  char *pcStack_2d8;
  int i_2;
  vec_golf_geo_generator_data_arg_t args;
  golf_script_t *script;
  golf_geo_generator_data_t generator_data_copy;
  undefined1 local_288 [8];
  golf_geo_face_t face_copy;
  int n___2;
  int i___2;
  vec_vec2_t uvs_copy_1;
  int n___1;
  int i___1;
  vec_int_t idx_copy;
  golf_geo_face_t face;
  char *pcStack_120;
  int i_1;
  vec_golf_geo_face_t faces_copy;
  golf_geo_point_t point_copy;
  golf_geo_point_t point;
  int local_cc;
  char *pcStack_c8;
  int i;
  vec_golf_geo_point_t points_copy;
  golf_geo_t *geo_copy;
  golf_geo_t *geo;
  int local_40;
  int local_3c;
  int n__;
  int i__;
  vec_vec2_t uvs_copy;
  golf_lightmap_section_t *lightmap_section_copy;
  golf_lightmap_section_t *lightmap_section;
  golf_entity_t *entity_local;
  
  memcpy(__return_storage_ptr__,entity,0x510);
  lightmap_name = golf_entity_get_lightmap_section(entity);
  uvs_copy.alloc_category = golf_entity_get_lightmap_section(__return_storage_ptr__)->lightmap_name;
  if (lightmap_name != (golf_lightmap_section_t *)0x0) {
    memset(&n__,0,0x18);
    uvs_copy._8_8_ = (long)"data/levels/level-1.level" + 0x14;
    local_40 = (lightmap_name->uvs).length;
    iVar6 = vec_reserve_po2_((char **)&n__,(int *)&uvs_copy,(int *)((long)&uvs_copy.data + 4),8,
                             (int)uvs_copy.data + local_40,"level");
    pcVar5 = uvs_copy.alloc_category;
    if (iVar6 == 0) {
      for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
        *(vec2 *)(_n__ + (long)(int)uvs_copy.data * 8) = (lightmap_name->uvs).data[local_3c];
        uvs_copy.data._0_4_ = (int)uvs_copy.data + 1;
      }
    }
    uvs.capacity = uvs_copy.data._4_4_;
    uvs.length = (int)uvs_copy.data;
    uvs.data = (vec2 *)_n__;
    uvs.alloc_category = (char *)uvs_copy._8_8_;
    golf_lightmap_section((golf_lightmap_section_t *)&geo,lightmap_name->lightmap_name,uvs);
    memcpy(pcVar5,&geo,0x60);
    golf_lightmap_section_finalize((golf_lightmap_section_t *)uvs_copy.alloc_category);
  }
  pgVar7 = golf_entity_get_geo(entity);
  points_copy.alloc_category = (char *)golf_entity_get_geo(__return_storage_ptr__);
  if (pgVar7 != (golf_geo_t *)0x0) {
    memset(&stack0xffffffffffffff38,0,0x18);
    points_copy._8_8_ = anon_var_dwarf_14303;
    for (local_cc = 0; local_cc < (pgVar7->points).length; local_cc = local_cc + 1) {
      pgVar1 = (pgVar7->points).data + local_cc;
      uVar2 = (pgVar1->position).x;
      uVar3 = (pgVar1->position).y;
      uVar4 = (pgVar1->position).z;
      faces_copy.alloc_category = (char *)CONCAT44(uVar3,uVar2);
      position.z = (float)uVar4;
      position._0_8_ = faces_copy.alloc_category;
      gVar9 = golf_geo_point(position);
      iVar6 = vec_expand_(&stack0xffffffffffffff38,(int *)&points_copy,
                          (int *)((long)&points_copy.data + 4),0x10,(char *)points_copy._8_8_);
      if (iVar6 == 0) {
        *(long *)(pcStack_c8 + (long)(int)points_copy.data * 0x10) = gVar9._0_8_;
        *(long *)(pcStack_c8 + (long)(int)points_copy.data * 0x10 + 8) = gVar9.position._4_8_;
        points_copy.data._0_4_ = (int)points_copy.data + 1;
      }
    }
    memset(&stack0xfffffffffffffee0,0,0x18);
    faces_copy._8_8_ = anon_var_dwarf_14303;
    for (face.water_dir.z = 0.0; (int)face.water_dir.z < (pgVar7->faces).length;
        face.water_dir.z = (float)((int)face.water_dir.z + 1)) {
      memcpy(&idx_copy.alloc_category,(pgVar7->faces).data + (int)face.water_dir.z,0x90);
      memset(&n___1,0,0x18);
      idx_copy._8_8_ = anon_var_dwarf_1db45;
      uvs_copy_1.alloc_category._0_4_ = (int)face.idx.data;
      iVar6 = vec_reserve_po2_((char **)&n___1,(int *)&idx_copy,(int *)((long)&idx_copy.data + 4),4,
                               (int)idx_copy.data + (int)face.idx.data,"face");
      if (iVar6 == 0) {
        for (uvs_copy_1.alloc_category._4_4_ = 0;
            uvs_copy_1.alloc_category._4_4_ < (int)uvs_copy_1.alloc_category;
            uvs_copy_1.alloc_category._4_4_ = uvs_copy_1.alloc_category._4_4_ + 1) {
          *(undefined4 *)(_n___1 + (long)(int)idx_copy.data * 4) =
               *(undefined4 *)(face._64_8_ + (long)uvs_copy_1.alloc_category._4_4_ * 4);
          idx_copy.data._0_4_ = (int)idx_copy.data + 1;
        }
      }
      memset(&n___2,0,0x18);
      uvs_copy_1._8_8_ = anon_var_dwarf_1db45;
      face_copy.water_dir.y = face.uvs.data._0_4_;
      iVar6 = vec_reserve_po2_((char **)&n___2,(int *)&uvs_copy_1,
                               (int *)((long)&uvs_copy_1.data + 4),8,
                               (int)uvs_copy_1.data + (int)face.uvs.data._0_4_,"face");
      if (iVar6 == 0) {
        for (face_copy.water_dir.z = 0.0; (int)face_copy.water_dir.z < (int)face_copy.water_dir.y;
            face_copy.water_dir.z = (float)((int)face_copy.water_dir.z + 1)) {
          *(undefined8 *)(_n___2 + (long)(int)uvs_copy_1.data * 8) =
               *(undefined8 *)(face._96_8_ + (long)(int)face_copy.water_dir.z * 8);
          uvs_copy_1.data._0_4_ = (int)uvs_copy_1.data + 1;
        }
      }
      water_dir.z = face.water_dir.x;
      water_dir._0_8_ = face._124_8_;
      uvs_00.capacity = uvs_copy_1.data._4_4_;
      uvs_00.length = (int)uvs_copy_1.data;
      idx.capacity = idx_copy.data._4_4_;
      idx.length = (int)idx_copy.data;
      idx.data = (int *)_n___1;
      idx.alloc_category = (char *)idx_copy._8_8_;
      uvs_00.data = (vec2 *)_n___2;
      uvs_00.alloc_category = (char *)uvs_copy_1._8_8_;
      golf_geo_face((golf_geo_face_t *)local_288,(char *)((long)&idx_copy.alloc_category + 1),idx,
                    (golf_geo_face_uv_gen_type_t)face.idx.alloc_category,uvs_00,water_dir);
      iVar6 = vec_expand_(&stack0xfffffffffffffee0,(int *)&faces_copy,
                          (int *)((long)&faces_copy.data + 4),0x90,(char *)faces_copy._8_8_);
      if (iVar6 == 0) {
        lVar8 = (long)(int)faces_copy.data;
        faces_copy.data._0_4_ = (int)faces_copy.data + 1;
        memcpy(pcStack_120 + lVar8 * 0x90,local_288,0x90);
      }
    }
    args.alloc_category = ((pgVar7->generator_data).script)->path;
    memset(&stack0xfffffffffffffd28,0,0x18);
    args._8_8_ = anon_var_dwarf_14303;
    for (local_2dc = 0; local_2dc < (pgVar7->generator_data).args.length; local_2dc = local_2dc + 1)
    {
      iVar6 = vec_expand_(&stack0xfffffffffffffd28,(int *)&args,(int *)((long)&args.data + 4),0x58,
                          (char *)args._8_8_);
      if (iVar6 == 0) {
        lVar8 = (long)(int)args.data;
        args.data._0_4_ = (int)args.data + 1;
        memcpy(pcStack_2d8 + lVar8 * 0x58,(pgVar7->generator_data).args.data + local_2dc,0x58);
      }
    }
    args_00.capacity = args.data._4_4_;
    args_00.length = (int)args.data;
    args_00.data = (golf_geo_generator_data_arg_t *)pcStack_2d8;
    args_00.alloc_category = (char *)args._8_8_;
    golf_geo_generator_data(&local_300,(golf_script_t *)args.alloc_category,args_00);
    pcVar5 = points_copy.alloc_category;
    points.capacity = points_copy.data._4_4_;
    points.length = (int)points_copy.data;
    faces.capacity = faces_copy.data._4_4_;
    faces.length = (int)faces_copy.data;
    points.data = (golf_geo_point_t *)pcStack_c8;
    points.alloc_category = (char *)points_copy._8_8_;
    faces.data = (golf_geo_face_t *)pcStack_120;
    faces.alloc_category = (char *)faces_copy._8_8_;
    generator_data.args.data = local_300.args.data;
    generator_data.script = local_300.script;
    generator_data.args.length = local_300.args.length;
    generator_data.args.capacity = local_300.args.capacity;
    generator_data.args.alloc_category = local_300.args.alloc_category;
    golf_geo((golf_geo_t *)&entity_copy,points,faces,generator_data,(_Bool)(pgVar7->is_water & 1));
    memcpy(pcVar5,&entity_copy,0xe8);
    golf_geo_finalize((golf_geo_t *)points_copy.alloc_category);
  }
  return __return_storage_ptr__;
}

Assistant:

golf_entity_t golf_entity_make_copy(golf_entity_t *entity) {
    golf_entity_t entity_copy = *entity;

    golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
    golf_lightmap_section_t *lightmap_section_copy = golf_entity_get_lightmap_section(&entity_copy);
    if (lightmap_section) {
        vec_vec2_t uvs_copy;
        vec_init(&uvs_copy, "level");
        vec_pusharr(&uvs_copy, lightmap_section->uvs.data, lightmap_section->uvs.length);
        *lightmap_section_copy = golf_lightmap_section(lightmap_section->lightmap_name, uvs_copy);
        golf_lightmap_section_finalize(lightmap_section_copy);
    }

    golf_geo_t *geo = golf_entity_get_geo(entity);
    golf_geo_t *geo_copy = golf_entity_get_geo(&entity_copy);
    if (geo) {
        vec_golf_geo_point_t points_copy;
        vec_init(&points_copy, "geo");
        for (int i = 0; i < geo->points.length; i++) {
            golf_geo_point_t point = geo->points.data[i];
            golf_geo_point_t point_copy = golf_geo_point(point.position);
            vec_push(&points_copy, point_copy);
        }

        vec_golf_geo_face_t faces_copy;
        vec_init(&faces_copy, "geo");
        for (int i = 0; i < geo->faces.length; i++) {
            golf_geo_face_t face = geo->faces.data[i];

            vec_int_t idx_copy;
            vec_init(&idx_copy, "face");
            vec_pusharr(&idx_copy, face.idx.data, face.idx.length);

            vec_vec2_t uvs_copy;
            vec_init(&uvs_copy, "face");
            vec_pusharr(&uvs_copy, face.uvs.data, face.uvs.length);

            golf_geo_face_t face_copy = golf_geo_face(face.material_name, idx_copy, face.uv_gen_type, uvs_copy, face.water_dir);
            vec_push(&faces_copy, face_copy);
        }

        golf_geo_generator_data_t generator_data_copy;
        {
            golf_script_t *script = geo->generator_data.script;
            vec_golf_geo_generator_data_arg_t args;
            vec_init(&args, "geo");
            for (int i = 0; i < geo->generator_data.args.length; i++) {
                vec_push(&args, geo->generator_data.args.data[i]);
            }
            generator_data_copy = golf_geo_generator_data(script, args);
        }

        *geo_copy = golf_geo(points_copy, faces_copy, generator_data_copy, geo->is_water);
        golf_geo_finalize(geo_copy);
    }

    return entity_copy;
}